

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterNextPage(Fts5Index *p,Fts5SegIter *pIter)

{
  long lVar1;
  Fts5StructureSegment *pFVar2;
  int iVar3;
  Fts5Data *pFVar4;
  
  pFVar2 = pIter->pSeg;
  sqlite3_free(pIter->pLeaf);
  iVar3 = pIter->iLeafPgno;
  lVar1 = (long)iVar3 + 1;
  pIter->iLeafPgno = (int)lVar1;
  if (pIter->pNextLeaf == (Fts5Data *)0x0) {
    if (iVar3 < pFVar2->pgnoLast) {
      pFVar4 = fts5LeafRead(p,((ulong)(uint)pFVar2->iSegid << 0x25) + lVar1);
      pIter->pLeaf = pFVar4;
    }
    else {
      pIter->pLeaf = (Fts5Data *)0x0;
    }
  }
  else {
    pIter->pLeaf = pIter->pNextLeaf;
    pIter->pNextLeaf = (Fts5Data *)0x0;
  }
  pFVar4 = pIter->pLeaf;
  if (pFVar4 != (Fts5Data *)0x0) {
    iVar3 = pFVar4->szLeaf;
    pIter->iPgidxOff = iVar3;
    if (iVar3 < pFVar4->nn) {
      iVar3 = sqlite3Fts5GetVarint32(pFVar4->p + iVar3,(u32 *)&pIter->iEndofDoclist);
      pIter->iPgidxOff = pIter->iPgidxOff + iVar3;
    }
    else {
      pIter->iEndofDoclist = pFVar4->nn + 1;
    }
  }
  return;
}

Assistant:

static void fts5SegIterNextPage(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter              /* Iterator to advance to next page */
){
  Fts5Data *pLeaf;
  Fts5StructureSegment *pSeg = pIter->pSeg;
  fts5DataRelease(pIter->pLeaf);
  pIter->iLeafPgno++;
  if( pIter->pNextLeaf ){
    pIter->pLeaf = pIter->pNextLeaf;
    pIter->pNextLeaf = 0;
  }else if( pIter->iLeafPgno<=pSeg->pgnoLast ){
    pIter->pLeaf = fts5LeafRead(p, 
        FTS5_SEGMENT_ROWID(pSeg->iSegid, pIter->iLeafPgno)
    );
  }else{
    pIter->pLeaf = 0;
  }
  pLeaf = pIter->pLeaf;

  if( pLeaf ){
    pIter->iPgidxOff = pLeaf->szLeaf;
    if( fts5LeafIsTermless(pLeaf) ){
      pIter->iEndofDoclist = pLeaf->nn+1;
    }else{
      pIter->iPgidxOff += fts5GetVarint32(&pLeaf->p[pIter->iPgidxOff],
          pIter->iEndofDoclist
      );
    }
  }
}